

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReadThreadsGraph.hpp
# Opt level: O0

void __thiscall
ReadThreadsGraph::ReadThreadsGraph(ReadThreadsGraph *this,SequenceDistanceGraph *sdg,string *_name)

{
  DistanceGraph::DistanceGraph(&this->super_DistanceGraph,sdg,_name);
  std::
  unordered_map<long,_ThreadInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_ThreadInfo>_>_>
  ::unordered_map((unordered_map<long,_ThreadInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_ThreadInfo>_>_>
                   *)0x4e0c7a);
  std::
  unordered_map<long,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>_>_>
  ::unordered_map((unordered_map<long,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_std::vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>_>_>_>
                   *)0x4e0c88);
  return;
}

Assistant:

explicit ReadThreadsGraph(SequenceDistanceGraph & sdg,const std::string &_name="RTG"): DistanceGraph(sdg,_name) {}